

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

void __thiscall
cs::repl::interpret(repl *this,string *code,
                   deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *line)

{
  method_base *pmVar1;
  initializer_list<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> __l;
  initializer_list<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> __l_00;
  initializer_list<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> __l_01;
  initializer_list<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> __l_02;
  initializer_list<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> __l_03;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 uVar4;
  undefined4 extraout_var_01;
  method_base **ppmVar5;
  undefined8 in_RDX;
  long in_RDI;
  lang_error *le;
  exception *e;
  exception *e_1;
  domain_type domain;
  method_base *expected_method;
  method_base *m;
  statement_base *sptr;
  domain_manager *in_stack_fffffffffffff808;
  compiler_type *in_stack_fffffffffffff810;
  domain_type *in_stack_fffffffffffff818;
  compiler_type *in_stack_fffffffffffff820;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *in_stack_fffffffffffff830;
  allocator_type *in_stack_fffffffffffff838;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *in_stack_fffffffffffff840;
  iterator in_stack_fffffffffffff848;
  stack_type<cs::method_base_*,_std::allocator> *in_stack_fffffffffffff850;
  method_base **in_stack_fffffffffffff858;
  stack_type<cs::method_base_*,_std::allocator> *in_stack_fffffffffffff860;
  undefined1 **local_778;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_fffffffffffff8c8;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_fffffffffffff8d0;
  undefined1 **local_720;
  undefined1 **local_698;
  undefined1 **local_660;
  undefined1 **local_5f8;
  undefined1 *local_4a0 [10];
  undefined8 *local_450;
  undefined8 local_448;
  undefined1 local_440 [88];
  undefined8 *local_3e8;
  undefined1 *local_3e0 [10];
  undefined8 *local_390;
  undefined8 local_388;
  undefined1 local_380 [88];
  undefined8 *local_328;
  undefined1 *local_320 [10];
  undefined8 *local_2d0;
  undefined8 local_2c8;
  undefined1 local_2c0 [88];
  undefined8 *local_268;
  undefined1 *local_260 [10];
  undefined8 *local_210;
  undefined8 local_208;
  undefined1 local_200 [86];
  undefined1 local_1aa;
  allocator local_1a9;
  string local_1a8 [40];
  undefined8 *local_180;
  undefined1 *local_178 [10];
  undefined8 *local_128;
  undefined8 local_120;
  undefined1 local_118 [80];
  undefined1 local_c8 [96];
  method_base *local_68;
  undefined1 local_5a;
  allocator local_59;
  string local_58 [48];
  method_base *local_28;
  long local_20;
  undefined8 local_18;
  
  local_20 = 0;
  local_18 = in_RDX;
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1b3bb7);
  std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1b3bbf);
  local_28 = compiler_type::match_method
                       (in_stack_fffffffffffff810,
                        (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                        in_stack_fffffffffffff808);
  iVar3 = (*local_28->_vptr_method_base[2])();
  pmVar1 = local_28;
  switch(iVar3) {
  case 0:
    local_5a = 1;
    uVar4 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"Null type of grammar.",&local_59);
    runtime_error::runtime_error
              ((runtime_error *)in_stack_fffffffffffff810,(string *)in_stack_fffffffffffff808);
    local_5a = 0;
    __cxa_throw(uVar4,&runtime_error::typeinfo,runtime_error::~runtime_error);
  case 1:
    bVar2 = stack_type<cs::method_base_*,_std::allocator>::empty
                      ((stack_type<cs::method_base_*,_std::allocator> *)(in_RDI + 0x50));
    if (bVar2) {
      iVar3 = (*local_28->_vptr_method_base[3])();
      pmVar1 = local_28;
      if (iVar3 == 0x19) {
        local_1aa = 1;
        uVar4 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1a8,"Hanging end statement.",&local_1a9);
        runtime_error::runtime_error
                  ((runtime_error *)in_stack_fffffffffffff810,(string *)in_stack_fffffffffffff808);
        local_1aa = 0;
        __cxa_throw(uVar4,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      local_268 = local_260;
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
                (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
      local_210 = local_260;
      local_208 = 1;
      std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::allocator
                ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)
                 0x1b4385);
      __l_00._M_len = (size_type)in_stack_fffffffffffff850;
      __l_00._M_array = in_stack_fffffffffffff848;
      std::
      deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
      ::deque(in_stack_fffffffffffff840,__l_00,in_stack_fffffffffffff838);
      (*pmVar1->_vptr_method_base[4])(pmVar1,in_RDI + 0xd0,local_200);
      std::
      deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
      ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                *)in_stack_fffffffffffff860);
      std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::~allocator
                ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)
                 0x1b43e9);
      local_660 = (undefined1 **)&local_210;
      do {
        local_660 = local_660 + -10;
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque
                  ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                   in_stack_fffffffffffff860);
        pmVar1 = local_28;
      } while (local_660 != local_260);
      local_328 = local_320;
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
                (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
      local_2d0 = local_320;
      local_2c8 = 1;
      std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::allocator
                ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)
                 0x1b44b1);
      __l_01._M_len = (size_type)in_stack_fffffffffffff850;
      __l_01._M_array = in_stack_fffffffffffff848;
      std::
      deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
      ::deque(in_stack_fffffffffffff840,__l_01,in_stack_fffffffffffff838);
      iVar3 = (*pmVar1->_vptr_method_base[5])(pmVar1,in_RDI + 0xd0,local_2c0);
      local_20 = CONCAT44(extraout_var_01,iVar3);
      std::
      deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
      ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                *)in_stack_fffffffffffff860);
      std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::~allocator
                ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)
                 0x1b452d);
      local_698 = (undefined1 **)&local_2d0;
      do {
        local_698 = local_698 + -10;
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque
                  ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                   in_stack_fffffffffffff860);
      } while (local_698 != local_320);
    }
    else {
      local_68 = (method_base *)0x0;
      iVar3 = (*local_28->_vptr_method_base[3])();
      if (iVar3 == 0x19) {
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1b3d8c);
        std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1b3d98);
        domain_manager::remove_set((domain_manager *)0x1b3da4);
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1b3dba);
        std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1b3dc6);
        domain_manager::get_domain(in_stack_fffffffffffff808);
        domain_type::domain_type((domain_type *)in_stack_fffffffffffff820,in_stack_fffffffffffff818)
        ;
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1b3e05);
        std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1b3e11);
        domain_manager::remove_domain((domain_manager *)in_stack_fffffffffffff810);
        ppmVar5 = stack_type<cs::method_base_*,_std::allocator>::top(in_stack_fffffffffffff850);
        (*(*ppmVar5)->_vptr_method_base[6])(*ppmVar5,in_RDI + 0xd0,local_c8);
        ppmVar5 = stack_type<cs::method_base_*,_std::allocator>::top(in_stack_fffffffffffff850);
        local_68 = *ppmVar5;
        stack_type<cs::method_base_*,_std::allocator>::pop(in_stack_fffffffffffff860);
        domain_type::~domain_type((domain_type *)in_stack_fffffffffffff810);
      }
      bVar2 = stack_type<cs::method_base_*,_std::allocator>::empty
                        ((stack_type<cs::method_base_*,_std::allocator> *)(in_RDI + 0x50));
      pmVar1 = local_28;
      if (bVar2) {
        iVar3 = (*local_28->_vptr_method_base[3])();
        if (iVar3 == 0x19) {
          iVar3 = (*local_28->_vptr_method_base[7])(local_28,local_68,in_RDI + 0xd0,in_RDI,local_18)
          ;
          local_20 = CONCAT44(extraout_var,iVar3);
        }
        else {
          iVar3 = (*local_68->_vptr_method_base[5])(local_68,in_RDI + 0xd0);
          local_20 = CONCAT44(extraout_var_00,iVar3);
        }
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::clear(in_stack_fffffffffffff830);
      }
      else {
        local_180 = local_178;
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
                  (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
        local_128 = local_178;
        local_120 = 1;
        std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::allocator
                  ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)
                   0x1b402e);
        __l._M_len = (size_type)in_stack_fffffffffffff850;
        __l._M_array = in_stack_fffffffffffff848;
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::deque(in_stack_fffffffffffff840,__l,in_stack_fffffffffffff838);
        (*pmVar1->_vptr_method_base[4])(pmVar1,in_RDI + 0xd0,local_118);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                  *)in_stack_fffffffffffff860);
        std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::~allocator
                  ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)
                   0x1b4092);
        local_5f8 = (undefined1 **)&local_128;
        do {
          local_5f8 = local_5f8 + -10;
          std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque
                    ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                     in_stack_fffffffffffff860);
        } while (local_5f8 != local_178);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::push_back((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                     *)in_stack_fffffffffffff810,(value_type *)in_stack_fffffffffffff808);
      }
    }
    break;
  case 2:
    stack_type<cs::method_base*,std::allocator>::push<cs::method_base*&>
              (in_stack_fffffffffffff860,in_stack_fffffffffffff858);
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1b47c8);
    std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1b47d4);
    domain_manager::add_domain((domain_manager *)in_stack_fffffffffffff810);
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1b47f6);
    std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1b4802);
    domain_manager::add_set((domain_manager *)0x1b480e);
    ppmVar5 = stack_type<cs::method_base_*,_std::allocator>::top(in_stack_fffffffffffff850);
    pmVar1 = *ppmVar5;
    local_3e8 = local_3e0;
    std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
              (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
    local_390 = local_3e0;
    local_388 = 1;
    std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::allocator
              ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)
               0x1b48a4);
    __l_02._M_len = (size_type)in_stack_fffffffffffff850;
    __l_02._M_array = in_stack_fffffffffffff848;
    std::
    deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ::deque(in_stack_fffffffffffff840,__l_02,in_stack_fffffffffffff838);
    (*pmVar1->_vptr_method_base[4])(pmVar1,in_RDI + 0xd0,local_380);
    std::
    deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
              *)in_stack_fffffffffffff860);
    std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::~allocator
              ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)
               0x1b4908);
    local_720 = (undefined1 **)&local_390;
    do {
      local_720 = local_720 + -10;
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque
                ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                 in_stack_fffffffffffff860);
    } while (local_720 != local_3e0);
    std::
    deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ::push_back((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                 *)in_stack_fffffffffffff810,(value_type *)in_stack_fffffffffffff808);
    break;
  case 3:
    std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
              (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
    local_450 = local_4a0;
    local_448 = 1;
    std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::allocator
              ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)
               0x1b4af3);
    __l_03._M_len = (size_type)in_stack_fffffffffffff850;
    __l_03._M_array = in_stack_fffffffffffff848;
    std::
    deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ::deque(in_stack_fffffffffffff840,__l_03,in_stack_fffffffffffff838);
    (*pmVar1->_vptr_method_base[5])(pmVar1,in_RDI + 0xd0,local_440);
    std::
    deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
              *)in_stack_fffffffffffff860);
    std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::~allocator
              ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)
               0x1b4b57);
    local_778 = (undefined1 **)&local_450;
    do {
      local_778 = local_778 + -10;
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque
                ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                 in_stack_fffffffffffff860);
    } while (local_778 != local_4a0);
  }
  if (local_20 != 0) {
    if ((*(byte *)(in_RDI + 0xe0) & 1) == 0) {
      statement_base::run((statement_base *)in_stack_fffffffffffff810);
    }
    else {
      statement_base::repl_run((statement_base *)in_stack_fffffffffffff810);
    }
  }
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1b51f6);
  std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1b51fe);
  compiler_type::utilize_metadata(in_stack_fffffffffffff820);
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1b521a);
  std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1b5226);
  domain_manager::clear_set((domain_manager *)0x1b5232);
  return;
}

Assistant:

void repl::interpret(const string &code, std::deque<token_base *> &line)
	{
		statement_base *sptr = nullptr;
		try {
			method_base *m = context->compiler->match_method(line);
			switch (m->get_type()) {
			case method_types::null:
				throw runtime_error("Null type of grammar.");
				break;
			case method_types::single: {
				if (!methods.empty()) {
					method_base *expected_method = nullptr;
					if (m->get_target_type() == statement_types::end_) {
						context->instance->storage.remove_set();
						domain_type domain = std::move(context->instance->storage.get_domain());
						context->instance->storage.remove_domain();
						methods.top()->postprocess(context, domain);
						expected_method = methods.top();
						methods.pop();
					}
					if (methods.empty()) {
						if (m->get_target_type() == statement_types::end_)
							sptr = static_cast<method_end *>(m)->translate_end(expected_method, context, tmp,
							        line);
						else
							sptr = expected_method->translate(context, tmp);
						tmp.clear();
					}
					else {
						m->preprocess(context, {line});
						tmp.push_back(line);
					}
				}
				else {
					if (m->get_target_type() == statement_types::end_)
						throw runtime_error("Hanging end statement.");
					else {
						m->preprocess(context, {line});
						sptr = m->translate(context, {line});
					}
				}
			}
			break;
			case method_types::block: {
				methods.push(m);
				context->instance->storage.add_domain();
				context->instance->storage.add_set();
				methods.top()->preprocess(context, {line});
				tmp.push_back(line);
			}
			break;
			case method_types::jit_command:
				m->translate(context, {line});
				break;
			}
			if (sptr != nullptr)
				echo ? sptr->repl_run() : sptr->run();
		}
		catch (const lang_error &le) {
			reset_status();
			context->compiler->utilize_metadata();
			context->instance->storage.clear_set();
			throw fatal_error(std::string("Uncaught exception: ") + le.what());
		}
		catch (const cs::exception &e) {
			reset_status();
			context->compiler->utilize_metadata();
			context->instance->storage.clear_set();
			throw e;
		}
		catch (const std::exception &e) {
			reset_status();
			context->compiler->utilize_metadata();
			context->instance->storage.clear_set();
			throw exception(line_num, context->file_path, code, e.what());
		}
		context->compiler->utilize_metadata();
		context->instance->storage.clear_set();
	}